

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

char parse_hex(char *s)

{
  char cVar1;
  char cVar2;
  char temp_1;
  char temp;
  int n2;
  int n1;
  char *s_local;
  
  if ((*s < '0') || ('9' < *s)) {
    cVar1 = *s + -0x57;
  }
  else {
    cVar1 = *s + -0x30;
  }
  if ((s[1] < '0') || ('9' < s[1])) {
    cVar2 = (s[1] | 0x20U) + 0xa9;
  }
  else {
    cVar2 = s[1] + -0x30;
  }
  return cVar1 * '\x10' + cVar2;
}

Assistant:

static char parse_hex(const char *s) noexcept {
    int n1, n2;
    if (*s >= '0' && *s <= '9')
        n1 = *s - '0';
    else {
        char temp = *s | 32;
        n1 = temp - 'a' + 10;
    }
    if (*(s + 1) >= '0' && *(s + 1) <= '9')
        n2 = *(s + 1) - '0';
    else {
        char temp = *(s + 1) | 32;
        n2 = temp - 'a' + 10;
    }
    return (n1 * 16 + n2);
}